

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

vector<Pathie::Path,_std::allocator<Pathie::Path>_> * __thiscall
Pathie::Path::burst(vector<Pathie::Path,_std::allocator<Pathie::Path>_> *__return_storage_ptr__,
                   Path *this,bool descend)

{
  long lVar1;
  Path local_130;
  string lastcomponent;
  string prefix;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = '\0';
  if (*(this->m_path)._M_dataplus._M_p == '/') {
    std::__cxx11::string::string((string *)&local_90,"/",(allocator *)&local_130);
    Path((Path *)&lastcomponent,&local_90);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
              (__return_storage_ptr__,(value_type *)&lastcomponent);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::append((char *)&prefix);
  }
  while (lVar1 = std::__cxx11::string::find((char *)this,0x10f18c), lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&lastcomponent,(ulong)this);
    if (descend) {
      std::operator+(&local_50,&prefix,&lastcomponent);
      Path(&local_130,&local_50);
      std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
                (__return_storage_ptr__,&local_130);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::append((string *)&prefix);
      std::__cxx11::string::append((char *)&prefix);
    }
    else {
      std::__cxx11::string::string((string *)&local_70,(string *)&lastcomponent);
      Path(&local_130,&local_70);
      std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
                (__return_storage_ptr__,&local_130);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::substr((ulong)&lastcomponent,(ulong)this);
  if (descend) {
    std::operator+(&local_b0,&prefix,&lastcomponent);
    Path(&local_130,&local_b0);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
              (__return_storage_ptr__,&local_130);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::string((string *)&local_d0,(string *)&lastcomponent);
    Path(&local_130,&local_d0);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
              (__return_storage_ptr__,&local_130);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::vector<Path> Path::burst(bool descend /* = false */) const
{
  size_t pos = 0;
  size_t lastpos = 0;
  std::vector<Path> results;
  std::string prefix;

  // Take care of leading / of absolute paths
  if (m_path[0] == '/') {
    results.push_back(Path("/"));
    prefix.append("/");

    // Adjust pos so we don’t find the initial /
    pos++;
    lastpos++;
  }

  while((pos = m_path.find("/", pos)) != string::npos) {
    std::string component = m_path.substr(lastpos, pos - lastpos);

    if (descend) {
      results.push_back(Path(prefix + component));
      prefix.append(component);
      prefix.append("/");
    }
    else {
      results.push_back(Path(component));
    }

    lastpos = pos + 1;
    pos++;
  }

  std::string lastcomponent = m_path.substr(lastpos);

  if (descend)
    results.push_back(Path(prefix + lastcomponent)); // Note no trailing /
  else
    results.push_back(Path(lastcomponent));

  return results;
}